

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral.hpp
# Opt level: O1

string * __thiscall
viennamath::op_rt_integral<viennamath::rt_expression_interface<double>>::str_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"rt_integral[",0xc);
  poVar1 = operator<<(local_190,(rt_interval<viennamath::rt_expression_interface<double>_> *)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = operator<<(poVar1,(rt_variable<viennamath::rt_expression_interface<double>_> *)
                             ((long)this + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
      {
        std::stringstream ss;

        ss << "rt_integral[" << interval_ << ", " << integration_variable_ << "]";
        return ss.str();
      }